

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall xmrig::Api::exec(Api *this,IApiRequest *request)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  pointer ppIVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 uVar7;
  pointer ppIVar8;
  bool bVar9;
  Value features;
  Data local_a8;
  Data local_98;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  iVar3 = (*request->_vptr_IApiRequest[0xe])(request);
  if (iVar3 == 1) {
    iVar3 = (*request->_vptr_IApiRequest[0xc])(request);
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
                 (CONCAT44(extraout_var,iVar3) + 0x10);
    (*request->_vptr_IApiRequest[2])(request);
    iVar3 = (*request->_vptr_IApiRequest[0xd])(request);
    local_40.s = "id";
    local_40.length = 2;
    local_50.s = this->m_id;
    sVar5 = strlen(local_50.s);
    local_50.length = (SizeType)sVar5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_00,iVar3),&local_40,&local_50,allocator);
    iVar3 = (*request->_vptr_IApiRequest[0xd])(request);
    local_60.s = "worker_id";
    local_60.length = 9;
    local_70.s = this->m_workerId;
    sVar5 = strlen(local_70.s);
    local_70.length = (SizeType)sVar5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_01,iVar3),&local_60,&local_70,allocator);
    iVar3 = (*request->_vptr_IApiRequest[0xd])(request);
    local_80.s = "uptime";
    local_80.length = 6;
    lVar6 = std::chrono::_V2::system_clock::now();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(extraout_var_02,iVar3),&local_80,
               (lVar6 / 1000000 - this->m_timestamp) / 1000,allocator);
    iVar3 = (*request->_vptr_IApiRequest[0xd])(request);
    iVar4 = (*request->_vptr_IApiRequest[6])(request);
    local_98.s.str = (Ch *)0x40500000018a25d;
    local_98.n = (Number)0xa;
    local_a8.n = (Number)0x0;
    local_a8.s.str = (Ch *)((ulong)(ushort)(((ushort)iVar4 & 0xff) + 9) << 0x30);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_03,iVar3),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,allocator);
    local_98.n.i64 = (Number)0x0;
    local_98.s.str = (Ch *)0x4000000000000;
    local_a8.s.str = (Ch *)0x40500000018a07b;
    local_a8.n = (Number)0x3;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a8.s,allocator);
    local_a8.s.str = (Ch *)0x40500000018a07f;
    local_a8.n = (Number)0x4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a8.s,allocator);
    local_a8.s.str = (Ch *)0x40500000018d1f1;
    local_a8.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a8.s,allocator);
    local_a8.s.str = (Ch *)0x40500000018a1cc;
    local_a8.n = (Number)0x3;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a8.s,allocator);
    local_a8.s.str = (Ch *)0x40500000018a2e7;
    local_a8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a8.s,allocator);
    iVar3 = (*request->_vptr_IApiRequest[0xd])(request);
    local_a8.s.str = (Ch *)0x40500000018d1f7;
    local_a8.n.i64 = (Number)0x8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_04,iVar3),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,allocator);
  }
  ppIVar8 = (this->m_listeners).
            super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_listeners).
            super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar9 = ppIVar8 == ppIVar1;
  if (!bVar9) {
    (*(*ppIVar8)->_vptr_IApiListener[2])(*ppIVar8,request);
    iVar3 = (*request->_vptr_IApiRequest[4])(request);
    cVar2 = (char)iVar3;
    while (cVar2 == '\0') {
      ppIVar8 = ppIVar8 + 1;
      bVar9 = ppIVar8 == ppIVar1;
      if (bVar9) goto LAB_00152255;
      (*(*ppIVar8)->_vptr_IApiListener[2])(*ppIVar8,request);
      iVar3 = (*request->_vptr_IApiRequest[4])(request);
      cVar2 = (char)iVar3;
    }
    if (!bVar9) {
      return;
    }
  }
LAB_00152255:
  iVar3 = (*request->_vptr_IApiRequest[5])(request);
  uVar7 = 200;
  if ((char)iVar3 != '\0') {
    uVar7 = 0x194;
  }
  (*request->_vptr_IApiRequest[0x10])(request,uVar7);
  return;
}

Assistant:

void xmrig::Api::exec(IApiRequest &request)
{
    using namespace rapidjson;

    if (request.type() == IApiRequest::REQ_SUMMARY) {
        auto &allocator = request.doc().GetAllocator();

        request.accept();
        request.reply().AddMember("id",         StringRef(m_id),       allocator);
        request.reply().AddMember("worker_id",  StringRef(m_workerId), allocator);
        request.reply().AddMember("uptime",     (Chrono::currentMSecsSinceEpoch() - m_timestamp) / 1000, allocator);
        request.reply().AddMember("restricted", request.isRestricted(), allocator);

        Value features(kArrayType);
#       ifdef XMRIG_FEATURE_API
        features.PushBack("api", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HTTP
        features.PushBack("http", allocator);
#       endif
#       ifdef XMRIG_FEATURE_LIBCPUID
        features.PushBack("cpuid", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HWLOC
        features.PushBack("hwloc", allocator);
#       endif
#       ifdef XMRIG_FEATURE_TLS
        features.PushBack("tls", allocator);
#       endif
#       ifdef XMRIG_FEATURE_OPENCL
        features.PushBack("opencl", allocator);
#       endif
        request.reply().AddMember("features", features, allocator);
    }

    for (IApiListener *listener : m_listeners) {
        listener->onRequest(request);

        if (request.isDone()) {
            return;
        }
    }

    request.done(request.isNew() ? HTTP_STATUS_NOT_FOUND : HTTP_STATUS_OK);
}